

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O1

void __thiscall
CheckedTimedMutexTest_RecurseTryLockFor_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedTimedMutexTest_RecurseTryLockFor_Test<yamc::checked::timed_mutex> *this)

{
  element_type *peVar1;
  DeathTest *pDVar2;
  DeathTest *pDVar3;
  bool bVar4;
  int iVar5;
  char *message;
  StringLike<const_char_*> *regex;
  DeathTest *gtest_dt;
  TrueWithString gtest_msg;
  TypeParam mtx;
  DeathTest *local_100;
  undefined1 local_f8 [24];
  undefined8 uStack_e0;
  AssertHelper local_c8 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a8;
  mutex_base local_90;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)&local_90);
  peVar1 = (element_type *)(local_f8 + 0x10);
  uStack_e0 = 0;
  local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = peVar1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    yamc::checked::detail::mutex_base::lock(&local_90);
  }
  if ((element_type *)local_f8._0_8_ != peVar1) {
    operator_delete((void *)local_f8._0_8_);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_c8[0].data_ = (AssertHelperData *)0x1cfcb9;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_f8,
               (testing *)local_c8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a8,(PolymorphicMatcher *)local_f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("mtx.try_lock_for(std::chrono::seconds(1))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0xe9,&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a8);
    pDVar2 = local_100;
    iVar5 = 3;
    if (bVar4) {
      if (local_100 != (DeathTest *)0x0) {
        iVar5 = (*local_100->_vptr_DeathTest[2])(local_100);
        pDVar3 = local_100;
        if (iVar5 == 0) {
          testing::KilledBySignal::KilledBySignal((KilledBySignal *)local_f8,6);
          iVar5 = (*local_100->_vptr_DeathTest[3])();
          bVar4 = testing::KilledBySignal::operator()((KilledBySignal *)local_f8,iVar5);
          iVar5 = (*pDVar3->_vptr_DeathTest[4])(pDVar3,(ulong)bVar4);
          if ((char)iVar5 != '\0') goto LAB_00186077;
          iVar5 = 3;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              local_f8._0_8_ = (element_type *)0x1;
              yamc::checked::timed_mutex::try_lock_for<long,std::ratio<1l,1l>>
                        ((timed_mutex *)&local_90,(duration<long,_std::ratio<1L,_1L>_> *)local_f8);
            }
            (*local_100->_vptr_DeathTest[5])(local_100,2);
            (*pDVar3->_vptr_DeathTest[5])(pDVar3,0);
          }
LAB_00186077:
          iVar5 = 0;
          bVar4 = true;
        }
        (*pDVar2->_vptr_DeathTest[1])(pDVar2);
        if (!bVar4) goto LAB_0018608a;
      }
      iVar5 = 0;
    }
LAB_0018608a:
    if (iVar5 != 0) {
      if (iVar5 != 3) goto LAB_0018612f;
      goto LAB_00186097;
    }
  }
  else {
LAB_00186097:
    testing::Message::Message((Message *)local_f8);
    message = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xe9,message);
    testing::internal::AssertHelper::operator=(local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    if ((element_type *)local_f8._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_f8._0_8_ + 8))();
    }
  }
  uStack_e0 = 0;
  local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = peVar1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    yamc::checked::detail::mutex_base::unlock(&local_90);
  }
  if ((element_type *)local_f8._0_8_ != peVar1) {
    operator_delete((void *)local_f8._0_8_);
  }
LAB_0018612f:
  yamc::checked::timed_mutex::~timed_mutex((timed_mutex *)&local_90);
  return;
}

Assistant:

TYPED_TEST(CheckedTimedMutexTest, RecurseTryLockFor) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  EXPECT_CHECK_FAILURE(mtx.try_lock_for(std::chrono::seconds(1)));
  ASSERT_NO_THROW(mtx.unlock());
}